

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

ion_err_t dictionary_open(ion_dictionary_handler_t *handler,ion_dictionary_t *dictionary,
                         ion_dictionary_config_info_t *config)

{
  ion_dictionary_id_t id;
  ion_key_type_t key_type;
  ion_key_size_t key_size;
  ion_value_size_t value_size;
  code *pcVar1;
  _func_ion_err_t_ion_dictionary_t_ptr *key;
  ion_key_t value;
  ion_value_t pvVar2;
  ion_err_t iVar3;
  ion_dictionary_compare_t p_Var4;
  _func_ion_err_t_ion_dictionary_t_ptr *p_Var5;
  undefined1 auStack_130 [8];
  undefined1 auStack_128 [8];
  undefined8 uStack_120;
  undefined1 auStack_118 [15];
  bool local_109;
  ion_status_t local_108;
  ion_status_t status;
  ion_cursor_status_t cursor_status;
  ion_dictionary_config_info_t fallback_config;
  ion_err_t err;
  ion_dictionary_t fallback_dict;
  ion_dictionary_handler_t fallback_handler;
  ion_record_t record;
  ion_dict_cursor_t *cursor;
  ion_predicate_t predicate;
  ion_err_t error;
  ion_dictionary_compare_t compare;
  ion_dictionary_config_info_t *config_local;
  ion_dictionary_t *dictionary_local;
  ion_dictionary_handler_t *handler_local;
  
  uStack_120 = 0x104713;
  p_Var4 = dictionary_switch_compare(config->type);
  uStack_120 = 0x104731;
  predicate.destroy._7_1_ = (*handler->open_dictionary)(handler,dictionary,config,p_Var4);
  if (predicate.destroy._7_1_ == 0xf) {
    record.value = (ion_value_t)0x0;
    uStack_120 = 0x104759;
    ffdict_init((ion_dictionary_handler_t *)&fallback_dict.handler);
    status.count = config->id;
    fallback_config.id = config->type;
    fallback_config._4_4_ = config->key_size;
    fallback_config.type = config->value_size;
    fallback_config.key_size = 1;
    fallback_config.value_size = 0;
    fallback_config.dictionary_size._0_1_ = 0;
    uStack_120 = 0x1047c8;
    fallback_config.dictionary_type._3_1_ =
         dictionary_open((ion_dictionary_handler_t *)&fallback_dict.handler,
                         (ion_dictionary_t *)&fallback_config.dictionary_status,
                         (ion_dictionary_config_info_t *)&status.count);
    handler_local._7_1_ = fallback_config.dictionary_type._3_1_;
    if (fallback_config.dictionary_type._3_1_ == dictionary_type_bpp_tree_t >> 0x18) {
      uStack_120 = 0x1047f9;
      dictionary_build_predicate((ion_predicate_t *)&cursor,'\x02');
      uStack_120 = 0x10480d;
      handler_local._7_1_ =
           dictionary_find((ion_dictionary_t *)&fallback_config.dictionary_status,
                           (ion_predicate_t *)&cursor,(ion_dict_cursor_t **)&record.value);
      fallback_config.dictionary_type._3_1_ = handler_local._7_1_;
      if (handler_local._7_1_ == dictionary_type_bpp_tree_t >> 0x18) {
        fallback_handler.close_dictionary =
             (_func_ion_err_t_ion_dictionary_t_ptr *)
             (auStack_118 + -((long)config->key_size + 0xfU & 0xfffffffffffffff0));
        p_Var5 = (_func_ion_err_t_ion_dictionary_t_ptr *)
                 (auStack_118 + -((long)config->key_size + 0xfU & 0xfffffffffffffff0) +
                 -((long)config->value_size + 0xfU & 0xfffffffffffffff0));
        record.key = p_Var5;
        id = config->id;
        key_type = config->type;
        key_size = config->key_size;
        value_size = config->value_size;
        *(ion_dictionary_size_t *)(p_Var5 + -0x10) = config->dictionary_size;
        *(undefined8 *)(p_Var5 + -0x18) = 0x1048a0;
        handler_local._7_1_ =
             dictionary_create(handler,dictionary,id,key_type,key_size,value_size,
                               *(ion_dictionary_size_t *)(p_Var5 + -0x10));
        if (handler_local._7_1_ == dictionary_type_bpp_tree_t >> 0x18) {
          fallback_config.dictionary_type._3_1_ = dictionary_type_bpp_tree_t >> 0x18;
          do {
            pvVar2 = record.value;
            pcVar1 = *(code **)((long)record.value + 0x18);
            *(undefined8 *)(p_Var5 + -8) = 0x1048d9;
            status._3_1_ = (*pcVar1)(pvVar2,&fallback_handler.close_dictionary);
            value = record.key;
            key = fallback_handler.close_dictionary;
            local_109 = status._3_1_ == '\x04' || status._3_1_ == '\x02';
            if (status._3_1_ != '\x04' && status._3_1_ != '\x02') {
              if (status._3_1_ != '\x01') {
                return '\x12';
              }
              pcVar1 = *(code **)((long)record.value + 0x20);
              *(undefined8 *)(p_Var5 + -8) = 0x10498b;
              (*pcVar1)(&record.value);
              *(undefined8 *)(p_Var5 + -8) = 0x104997;
              iVar3 = dictionary_delete_dictionary
                                ((ion_dictionary_t *)&fallback_config.dictionary_status);
              if (iVar3 != '\0') {
                return iVar3;
              }
              predicate.destroy._7_1_ = dictionary_type_bpp_tree_t >> 0x18;
              goto LAB_001049b9;
            }
            *(undefined8 *)(p_Var5 + -8) = 0x104927;
            local_108 = dictionary_insert(dictionary,key,value);
          } while (local_108.error == '\0');
          pcVar1 = *(code **)((long)record.value + 0x20);
          *(undefined8 *)(p_Var5 + -8) = 0x104946;
          (*pcVar1)(&record.value);
          *(undefined8 *)(p_Var5 + -8) = 0x104952;
          dictionary_close((ion_dictionary_t *)&fallback_config.dictionary_status);
          *(undefined8 *)(p_Var5 + -8) = 0x10495b;
          dictionary_delete_dictionary(dictionary);
          handler_local._7_1_ = local_108.error;
        }
      }
    }
  }
  else {
LAB_001049b9:
    if (predicate.destroy._7_1_ == dictionary_type_bpp_tree_t >> 0x18) {
      dictionary->status = '\0';
      dictionary->instance->id = config->id;
    }
    else {
      dictionary->status = '\x02';
    }
    handler_local._7_1_ = predicate.destroy._7_1_;
  }
  return handler_local._7_1_;
}

Assistant:

ion_err_t
dictionary_open(
	ion_dictionary_handler_t		*handler,
	ion_dictionary_t				*dictionary,
	ion_dictionary_config_info_t	*config
) {
	ion_dictionary_compare_t compare	= dictionary_switch_compare(config->type);

	ion_err_t error						= handler->open_dictionary(handler, dictionary, config, compare);

	if (err_not_implemented == error) {
		ion_predicate_t				predicate;
		ion_dict_cursor_t			*cursor = NULL;
		ion_record_t				record;
		ion_dictionary_handler_t	fallback_handler;
		ion_dictionary_t			fallback_dict;
		ion_err_t					err;

		ffdict_init(&fallback_handler);

		ion_dictionary_config_info_t fallback_config = {
			config->id, 0, config->type, config->key_size, config->value_size, 1
		};

		err = dictionary_open(&fallback_handler, &fallback_dict, &fallback_config);

		if (err_ok != err) {
			return err;
		}

		dictionary_build_predicate(&predicate, predicate_all_records);
		err = dictionary_find(&fallback_dict, &predicate, &cursor);

		if (err_ok != err) {
			return err;
		}

		record.key		= alloca(config->key_size);
		record.value	= alloca(config->value_size);

		err				= dictionary_create(handler, dictionary, config->id, config->type, config->key_size, config->value_size, config->dictionary_size);

		if (err_ok != err) {
			return err;
		}

		ion_cursor_status_t cursor_status;

		while (cs_cursor_active == (cursor_status = cursor->next(cursor, &record)) || cs_cursor_initialized == cursor_status) {
			ion_status_t status = dictionary_insert(dictionary, record.key, record.value);

			if (err_ok != status.error) {
				cursor->destroy(&cursor);
				dictionary_close(&fallback_dict);
				dictionary_delete_dictionary(dictionary);
				return status.error;
			}
		}

		if (cursor_status != cs_end_of_results) {
			return err_uninitialized;
		}

		cursor->destroy(&cursor);

		err = dictionary_delete_dictionary(&fallback_dict);

		if (err_ok != err) {
			return err;
		}

		error = err_ok;
	}

	if (err_ok == error) {
		dictionary->status			= ion_dictionary_status_ok;
		dictionary->instance->id	= config->id;
	}
	else {
		dictionary->status = ion_dictionary_status_error;
	}

	return error;
}